

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,dec_writer f)

{
  uint uVar1;
  char cVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  format_specs local_58;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  local_48;
  
  local_58._8_8_ = specs._8_8_;
  local_58._0_8_ = specs._0_8_;
  local_48.prefix.size_ = prefix.size_;
  local_48.prefix.data_ = prefix.data_;
  local_48.size_ = (uint)num_digits + local_48.prefix.size_;
  local_48.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar3 = local_58._0_8_ & 0xffffffff;
    local_48.padding = 0;
    if (local_48.size_ <= uVar3) {
      local_48.padding = uVar3 - local_48.size_;
      local_48.size_ = uVar3;
    }
  }
  else {
    iVar4 = specs.precision;
    bVar5 = iVar4 - num_digits == 0;
    cVar2 = '0';
    if (bVar5 || iVar4 < num_digits) {
      cVar2 = local_48.fill;
    }
    local_48.fill = cVar2;
    uVar1 = iVar4 - num_digits;
    if (bVar5 || iVar4 < num_digits) {
      uVar1 = 0;
    }
    if (!bVar5 && num_digits <= iVar4) {
      local_48.size_ = ((ulong)local_58._0_8_ >> 0x20) + local_48.prefix.size_;
    }
    local_48.padding = (ulong)uVar1;
    if (((undefined1  [16])specs & (undefined1  [16])0xf00) == (undefined1  [16])0x0) {
      local_58._8_8_ = local_58._8_8_ | 0x200;
    }
  }
  local_48.f = f;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::dec_writer>>
            (this,&local_58,&local_48);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }